

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest16PrivateCertificateExtensions_::
Section16InvalidUnknownCriticalCertificateExtensionTest2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section16InvalidUnknownCriticalCertificateExtensionTest2
          (Section16InvalidUnknownCriticalCertificateExtensionTest2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest16PrivateCertificateExtensions,
                     Section16InvalidUnknownCriticalCertificateExtensionTest2) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate",
      "InvalidUnknownCriticalCertificateExtensionTest2EE"};
  const char* const crls[] = {"TrustAnchorRootCRL"};
  PkitsTestInfo info;
  info.test_number = "4.16.2";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}